

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O0

void msdfgen::generateSDF_legacy
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  SignedDistance b;
  SignedDistance a;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  reference this;
  EdgeSegment *pEVar5;
  float *pfVar6;
  Contour *extraout_XMM0_Qa;
  double dVar7;
  int local_f4;
  SignedDistance distance;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_a8;
  const_iterator edge;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_98;
  const_iterator contour;
  SignedDistance minDistance;
  Vector2 local_70;
  undefined1 local_60 [8];
  Point2 p;
  double dummy;
  int x;
  int row;
  int y;
  int h;
  int w;
  Vector2 *translate_local;
  Vector2 *scale_local;
  double range_local;
  Shape *shape_local;
  Bitmap<float> *output_local;
  
  iVar2 = Bitmap<float>::width(output);
  iVar3 = Bitmap<float>::height(output);
  for (x = 0; x < iVar3; x = x + 1) {
    if ((shape->inverseYAxis & 1U) == 0) {
      local_f4 = x;
    }
    else {
      local_f4 = (iVar3 - x) + -1;
    }
    for (dummy._4_4_ = 0; dummy._4_4_ < iVar2; dummy._4_4_ = dummy._4_4_ + 1) {
      Vector2::Vector2((Vector2 *)&minDistance.dot,(double)dummy._4_4_ + 0.5,(double)x + 0.5);
      local_70 = Vector2::operator/((Vector2 *)&minDistance.dot,scale);
      _local_60 = Vector2::operator-(&local_70,translate);
      SignedDistance::SignedDistance((SignedDistance *)&contour);
      local_98._M_current =
           (Contour *)
           std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin(&shape->contours)
      ;
      while( true ) {
        edge._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end(&shape->contours)
        ;
        bVar1 = __gnu_cxx::operator!=
                          (&local_98,
                           (__normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                            *)&edge);
        if (!bVar1) break;
        pCVar4 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&local_98);
        local_a8._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&pCVar4->edges);
        while( true ) {
          pCVar4 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&local_98);
          distance.dot = (double)std::
                                 vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                                 end(&pCVar4->edges);
          bVar1 = __gnu_cxx::operator!=
                            (&local_a8,
                             (__normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                              *)&distance.dot);
          if (!bVar1) break;
          this = __gnu_cxx::
                 __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_a8);
          pEVar5 = EdgeHolder::operator->(this);
          dVar7 = p.x;
          (*pEVar5->_vptr_EdgeSegment[5])(local_60,pEVar5,&p.y);
          a.dot = dVar7;
          a.distance = (double)extraout_XMM0_Qa;
          b.dot = minDistance.distance;
          b.distance = (double)contour._M_current;
          distance.distance = dVar7;
          bVar1 = operator<(a,b);
          if (bVar1) {
            minDistance.distance = distance.distance;
            contour._M_current = extraout_XMM0_Qa;
          }
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_a8);
        }
        __gnu_cxx::
        __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
        ::operator++(&local_98);
      }
      dVar7 = (double)contour._M_current / range;
      pfVar6 = Bitmap<float>::operator()(output,dummy._4_4_,local_f4);
      *pfVar6 = (float)(dVar7 + 0.5);
    }
  }
  return;
}

Assistant:

void generateSDF_legacy(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int w = output.width(), h = output.height();
#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel for
#endif
    for (int y = 0; y < h; ++y) {
        int row = shape.inverseYAxis ? h-y-1 : y;
        for (int x = 0; x < w; ++x) {
            double dummy;
            Point2 p = Vector2(x+.5, y+.5)/scale-translate;
            SignedDistance minDistance;
            for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
                for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                    SignedDistance distance = (*edge)->signedDistance(p, dummy);
                    if (distance < minDistance)
                        minDistance = distance;
                }
            output(x, row) = float(minDistance.distance/range+.5);
        }
    }
}